

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O1

int32_t uloc_getDisplayName_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  int iVar2;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  ulong uVar6;
  undefined4 extraout_var;
  UEnumeration *en;
  char *keyword;
  uint uVar7;
  long lVar8;
  UErrorCode destCapacity_00;
  UErrorCode *status_00;
  undefined8 in_R9;
  UErrorCode *pUVar9;
  undefined7 uVar10;
  char cVar11;
  undefined8 in_R10;
  uint uVar12;
  UErrorCode UVar13;
  uint uVar14;
  UChar *pUVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  UChar *pUVar19;
  bool bVar20;
  UErrorCode status;
  int32_t patLen;
  int32_t sepLen;
  UErrorCode local_d4;
  ushort local_d0;
  UChar local_ce;
  ushort local_cc;
  UChar local_ca;
  UErrorCode *local_c8;
  uint local_bc;
  UChar *local_b8;
  uint local_b0;
  int local_ac;
  uint local_a8;
  uint local_a4;
  char *local_a0;
  uint local_94;
  UChar *local_90;
  UChar *local_88;
  char *local_80;
  uint local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  UChar *local_68;
  UChar *local_60;
  UChar *local_58;
  UChar *local_50;
  UEnumeration *local_48;
  UChar *local_40;
  char *local_38;
  
  local_a4 = 0;
  local_a8 = 0;
  iVar1 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0) || (dest == (UChar *)0x0 && destCapacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_d4 = U_ZERO_ERROR;
      local_c8 = pErrorCode;
      local_b8 = dest;
      local_a0 = displayLocale;
      local_80 = locale;
      resB = ures_open_63("icudt63l-lang",displayLocale,&local_d4);
      resB_00 = ures_getByKeyWithFallback_63
                          (resB,"localeDisplayPattern",(UResourceBundle *)0x0,&local_d4);
      pUVar3 = ures_getStringByKeyWithFallback_63
                         (resB_00,"separator",(int32_t *)&local_a4,&local_d4);
      local_68 = ures_getStringByKeyWithFallback_63
                           (resB_00,"pattern",(int32_t *)&local_a8,&local_d4);
      ures_close_63(resB_00);
      ures_close_63(resB);
      local_88 = L"{0}, {1}";
      if (local_a4 != 0) {
        local_88 = pUVar3;
      }
      pUVar4 = u_strstr_63(local_88,L"{0}");
      pUVar5 = u_strstr_63(local_88,L"{1}");
      pUVar3 = local_68;
      if (pUVar5 < pUVar4 || (pUVar5 == (UChar *)0x0 || pUVar4 == (UChar *)0x0)) {
        *local_c8 = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        local_88 = pUVar4 + 3;
        local_a4 = (uint)((ulong)((long)pUVar5 - (long)local_88) >> 1);
      }
      iVar1 = 0;
      if (pUVar5 >= pUVar4 && (pUVar5 != (UChar *)0x0 && pUVar4 != (UChar *)0x0)) {
        if ((local_a8 == 0) ||
           ((local_a8 == 9 && (iVar1 = u_strncmp_63(local_68,L"{0} ({1})",9), iVar1 == 0)))) {
          local_a8 = 9;
          local_68 = L"{0} ({1})";
          local_74 = 5;
          local_ce = L'(';
          local_d0 = 0x5b;
          local_ca = L')';
          local_cc = 0x5d;
          local_6c = 0;
          local_90 = (UChar *)0x0;
        }
        else {
          pUVar4 = u_strstr_63(pUVar3,L"{0}");
          pUVar5 = u_strstr_63(pUVar3,L"{1}");
          bVar20 = pUVar4 == (UChar *)0x0;
          if (pUVar5 == (UChar *)0x0 || bVar20) {
            *local_c8 = U_ILLEGAL_ARGUMENT_ERROR;
            local_ce = L'(';
            local_d0 = 0x5b;
            local_ca = L')';
            local_cc = 0x5d;
            bVar16 = false;
          }
          else {
            uVar18 = (ulong)((long)pUVar4 - (long)pUVar3) >> 1;
            uVar6 = (ulong)((long)pUVar5 - (long)pUVar3) >> 1;
            uVar12 = (uint)uVar6;
            uVar17 = (uint)uVar18;
            bVar16 = (int)uVar12 < (int)uVar17;
            local_74 = uVar17;
            if ((int)uVar17 < (int)uVar12) {
              local_74 = uVar12;
            }
            if ((int)uVar12 < (int)uVar17) {
              uVar18 = uVar6;
            }
            pUVar4 = (UChar *)(uVar18 & 0xffffffff);
            pUVar3 = u_strchr_63(pUVar3,L'（');
            if (pUVar3 == (UChar *)0x0) {
              local_ce = L'(';
              local_d0 = 0x5b;
              local_ca = L')';
              local_cc = 0x5d;
            }
            else {
              local_ce = L'（';
              local_d0 = 0xff3b;
              local_ca = L'）';
              local_cc = 0xff3d;
            }
          }
          if (pUVar5 == (UChar *)0x0 || bVar20) {
            return 0;
          }
          local_6c = (uint)bVar16;
          local_90 = pUVar4;
        }
        pUVar9 = (UErrorCode *)CONCAT71((int7)((ulong)in_R9 >> 8),1);
        pUVar4 = (UChar *)0x0;
        uVar18 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
        pUVar3 = local_b8;
        status_00 = local_c8;
        do {
          pUVar19 = (UChar *)0x0;
          pUVar15 = (UChar *)0x0;
          pUVar5 = pUVar3;
          if (((int)local_90 != 0) &&
             (pUVar19 = (UChar *)((ulong)local_90 & 0xffffffff), pUVar15 = local_90,
             (int)local_90 <= destCapacity)) {
            if ((int)local_90 < 1) {
              pUVar15 = (UChar *)0x0;
            }
            else {
              lVar8 = 0;
              pUVar15 = (UChar *)0x0;
              do {
                pUVar3[(long)pUVar15] = local_68[(long)pUVar15];
                pUVar15 = (UChar *)((long)pUVar15 + 1);
                lVar8 = lVar8 + -2;
              } while (pUVar19 != pUVar15);
              pUVar5 = (UChar *)((long)pUVar3 - lVar8);
            }
          }
          local_58 = (UChar *)0x0;
          uVar12 = 0;
          local_48 = (UEnumeration *)0x0;
          local_ac = 0;
          local_78 = 0;
          local_70 = 0;
          local_40 = (UChar *)0x0;
          local_50 = pUVar4;
          do {
            iVar2 = (int)pUVar19;
            UVar13 = destCapacity - iVar2;
            if (U_ZERO_ERROR < UVar13) {
              pUVar5 = pUVar3 + iVar2;
            }
            pUVar4 = (UChar *)0x0;
            destCapacity_00 = UVar13;
            if (UVar13 < U_ILLEGAL_ARGUMENT_ERROR) {
              destCapacity_00 = U_ZERO_ERROR;
            }
            uVar17 = (uint)uVar18;
            if (uVar12 == local_6c) {
              if ((char)uVar18 == '\0') {
                uVar18 = 0;
LAB_002820a7:
                uVar17 = 0;
              }
              else {
                iVar1 = uloc_getDisplayLanguage_63
                                  (local_80,local_a0,pUVar5,destCapacity_00,status_00);
                pUVar4 = (UChar *)CONCAT44(extraout_var,iVar1);
                pUVar9 = (UErrorCode *)((ulong)pUVar9 & 0xffffffff);
                uVar18 = CONCAT71((int7)(uVar18 >> 8),0 < iVar1);
                pUVar19 = (UChar *)(ulong)(uint)(iVar1 + iVar2);
                pUVar3 = local_b8;
                status_00 = local_c8;
                uVar17 = 0;
                local_70 = iVar2;
                local_40 = pUVar4;
              }
            }
            else {
              if ((char)pUVar9 == '\0') {
                pUVar9 = (UErrorCode *)0x0;
                goto LAB_002820a7;
              }
              en = local_48;
              local_b0 = uVar17;
              local_94 = uVar12;
              switch((ulong)local_58 & 0xffffffff) {
              case 0:
                local_d4 = uloc_getDisplayScriptInContext_63
                                     (local_80,local_a0,pUVar5,destCapacity_00,status_00);
                local_bc = (uint)CONCAT71((uint7)(uint3)((uint)local_d4 >> 8),1);
                local_ac = iVar2;
                goto LAB_00282103;
              case 1:
                local_d4 = uloc_getDisplayCountry_63
                                     (local_80,local_a0,pUVar5,destCapacity_00,status_00);
                break;
              case 2:
                local_d4 = uloc_getDisplayVariant_63
                                     (local_80,local_a0,pUVar5,destCapacity_00,status_00);
                break;
              case 3:
                local_60 = pUVar19;
                en = uloc_openKeywords_63(local_80,status_00);
                status_00 = local_c8;
                pUVar19 = local_60;
              default:
                local_60 = pUVar19;
                keyword = uenum_next_63(en,&local_d4,status_00);
                local_bc = (uint)CONCAT71((int7)((ulong)keyword >> 8),keyword != (char *)0x0);
                local_48 = en;
                if (keyword == (char *)0x0) {
                  uenum_close_63(en);
                  local_d4 = U_ZERO_ERROR;
                  pUVar19 = local_60;
                }
                else {
                  local_38 = keyword;
                  local_d4 = uloc_getDisplayKeyword_63
                                       (keyword,local_a0,pUVar5,destCapacity_00,local_c8);
                  pUVar19 = local_60;
                  if (local_d4 == U_ZERO_ERROR) {
                    local_d4 = U_ZERO_ERROR;
                  }
                  else {
                    if (local_d4 < destCapacity_00) {
                      pUVar5[local_d4] = L'=';
                    }
                    local_d4 = local_d4 + U_ILLEGAL_ARGUMENT_ERROR;
                    if (destCapacity_00 - local_d4 == U_ZERO_ERROR || destCapacity_00 < local_d4) {
                      destCapacity_00 = U_ZERO_ERROR;
                    }
                    else {
                      pUVar5 = pUVar5 + local_d4;
                      destCapacity_00 = destCapacity_00 - local_d4;
                    }
                  }
                  if (*local_c8 == U_BUFFER_OVERFLOW_ERROR) {
                    *local_c8 = U_ZERO_ERROR;
                  }
                  pUVar9 = local_c8;
                  iVar1 = uloc_getDisplayKeywordValue_63
                                    (local_80,local_38,local_a0,pUVar5,destCapacity_00,local_c8);
                  if (local_d4 != U_ZERO_ERROR) {
                    if (iVar1 == 0) {
                      local_d4 = local_d4 + ~U_ZERO_ERROR;
                    }
                    if (U_ZERO_ERROR < UVar13) {
                      pUVar5 = pUVar3 + iVar2;
                    }
                    destCapacity_00 = UVar13;
                    if (UVar13 < U_ILLEGAL_ARGUMENT_ERROR) {
                      destCapacity_00 = U_ZERO_ERROR;
                    }
                  }
                  local_d4 = iVar1 + local_d4;
                }
                goto LAB_0028226c;
              }
              local_bc = (uint)CONCAT71((uint7)(uint3)((uint)local_d4 >> 8),1);
LAB_00282103:
LAB_0028226c:
              iVar2 = (int)pUVar19;
              if ((long)local_d4 < 1) {
                uVar10 = (undefined7)((ulong)pUVar9 >> 8);
                pUVar9 = (UErrorCode *)CONCAT71(uVar10,1);
                if ((char)local_bc == '\0') {
                  uVar12 = 0;
                  if (iVar2 != local_ac) {
                    uVar12 = local_a4;
                  }
                  uVar12 = iVar2 - uVar12;
                  pUVar19 = (UChar *)(ulong)uVar12;
                  local_78 = uVar12 - local_ac;
                  pUVar9 = (UErrorCode *)CONCAT71(uVar10,local_78 != 0 && local_ac <= (int)uVar12);
                }
              }
              else {
                if (local_a4 + local_d4 <= destCapacity_00) {
                  pUVar3 = pUVar5 + local_d4;
                  do {
                    pUVar9 = (UErrorCode *)(ulong)local_d0;
                    if ((*pUVar5 == local_ce) ||
                       (pUVar9 = (UErrorCode *)(ulong)local_cc, *pUVar5 == local_ca)) {
                      *pUVar5 = (UChar)pUVar9;
                    }
                    pUVar5 = pUVar5 + 1;
                  } while (pUVar5 < pUVar3);
                  if (0 < (int)local_a4) {
                    lVar8 = 0;
                    do {
                      pUVar9 = (UErrorCode *)(ulong)*(ushort *)((long)local_88 + lVar8);
                      *(ushort *)((long)pUVar5 + lVar8) = *(ushort *)((long)local_88 + lVar8);
                      lVar8 = lVar8 + 2;
                    } while ((ulong)local_a4 * 2 != lVar8);
                    pUVar5 = (UChar *)((long)pUVar5 + lVar8);
                  }
                }
                pUVar19 = (UChar *)(ulong)(uint)(iVar2 + local_a4 + local_d4);
                pUVar9 = (UErrorCode *)CONCAT71((int7)((ulong)pUVar9 >> 8),1);
              }
              uVar18 = (ulong)local_b0;
              pUVar4 = (UChar *)(ulong)((int)local_58 + 1);
              pUVar3 = local_b8;
              status_00 = local_c8;
              uVar12 = local_94;
              uVar17 = local_bc;
              local_58 = pUVar4;
            }
            if (*status_00 == U_BUFFER_OVERFLOW_ERROR) {
              *status_00 = U_ZERO_ERROR;
            }
            if ((char)uVar17 == '\0') {
              cVar11 = (char)uVar18;
              iVar2 = (int)pUVar19;
              if ((cVar11 == '\0') || ((char)pUVar9 == '\0')) {
                if (uVar12 == 0) {
                  local_90 = (UChar *)0x0;
                  pUVar19 = (UChar *)0x0;
                }
                else if (0 < iVar2) {
                  uVar17 = local_78;
                  if (cVar11 != '\0') {
                    uVar17 = (uint)local_40;
                  }
                  pUVar19 = (UChar *)(ulong)uVar17;
                  pUVar4 = (UChar *)(ulong)local_78;
                  if ((pUVar3 != (UChar *)0x0) && (pUVar4 = local_90, (int)local_90 != 0)) {
                    iVar2 = (int)local_90 + uVar17;
                    if (destCapacity < iVar2) {
                      pUVar4 = (UChar *)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
                      local_90 = (UChar *)0x0;
                      local_50 = pUVar4;
                    }
                    else {
                      iVar2 = local_ac;
                      if (cVar11 != '\0') {
                        iVar2 = local_70;
                      }
                      local_b0 = (uint)uVar18;
                      local_bc = (uint)pUVar9;
                      pUVar4 = u_memmove_63(pUVar3,pUVar3 + iVar2,uVar17);
                      pUVar9 = (UErrorCode *)(ulong)local_bc;
                      uVar18 = (ulong)local_b0;
                      pUVar3 = local_b8;
                      status_00 = local_c8;
                    }
                  }
                }
              }
              else {
                uVar17 = local_74;
                if (uVar12 != 0) {
                  uVar17 = local_a8;
                }
                pUVar4 = (UChar *)(ulong)uVar17;
                uVar14 = (int)pUVar15 + 3;
                pUVar15 = (UChar *)(ulong)uVar14;
                uVar7 = (uVar17 - uVar14) + iVar2;
                if ((int)uVar7 < destCapacity) {
                  pUVar5 = pUVar3 + iVar2;
                  if (0 < (int)(uVar17 - uVar14)) {
                    pUVar19 = local_68 + (int)uVar14;
                    do {
                      *pUVar5 = *pUVar19;
                      pUVar5 = pUVar5 + 1;
                      pUVar19 = pUVar19 + 1;
                      uVar14 = (int)pUVar15 + 1;
                      pUVar15 = (UChar *)(ulong)uVar14;
                    } while (uVar17 != uVar14);
                  }
                  pUVar19 = (UChar *)(ulong)uVar7;
                  pUVar9 = (UErrorCode *)((ulong)pUVar9 & 0xffffffff);
                }
                else {
                  pUVar19 = (UChar *)(ulong)uVar7;
                  pUVar15 = pUVar4;
                }
              }
              uVar12 = uVar12 + 1;
            }
          } while ((int)uVar12 < 2);
          pUVar4 = (UChar *)CONCAT71((int7)((ulong)pUVar4 >> 8),1);
        } while ((char)local_50 != '\0');
        iVar1 = u_terminateUChars_63(pUVar3,destCapacity,(int32_t)pUVar19,status_00);
      }
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayName(const char *locale,
                    const char *displayLocale,
                    UChar *dest, int32_t destCapacity,
                    UErrorCode *pErrorCode)
{
    static const UChar defaultSeparator[9] = { 0x007b, 0x0030, 0x007d, 0x002c, 0x0020, 0x007b, 0x0031, 0x007d, 0x0000 }; /* "{0}, {1}" */
    static const UChar sub0[4] = { 0x007b, 0x0030, 0x007d , 0x0000 } ; /* {0} */
    static const UChar sub1[4] = { 0x007b, 0x0031, 0x007d , 0x0000 } ; /* {1} */
    static const int32_t subLen = 3;
    static const UChar defaultPattern[10] = {
        0x007b, 0x0030, 0x007d, 0x0020, 0x0028, 0x007b, 0x0031, 0x007d, 0x0029, 0x0000
    }; /* {0} ({1}) */
    static const int32_t defaultPatLen = 9;
    static const int32_t defaultSub0Pos = 0;
    static const int32_t defaultSub1Pos = 5;

    int32_t length; /* of formatted result */

    const UChar *separator;
    int32_t sepLen = 0;
    const UChar *pattern;
    int32_t patLen = 0;
    int32_t sub0Pos, sub1Pos;
    
    UChar formatOpenParen         = 0x0028; // (
    UChar formatReplaceOpenParen  = 0x005B; // [
    UChar formatCloseParen        = 0x0029; // )
    UChar formatReplaceCloseParen = 0x005D; // ]

    UBool haveLang = TRUE; /* assume true, set false if we find we don't have
                              a lang component in the locale */
    UBool haveRest = TRUE; /* assume true, set false if we find we don't have
                              any other component in the locale */
    UBool retry = FALSE; /* set true if we need to retry, see below */

    int32_t langi = 0; /* index of the language substitution (0 or 1), virtually always 0 */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    {
        UErrorCode status = U_ZERO_ERROR;
        UResourceBundle* locbundle=ures_open(U_ICUDATA_LANG, displayLocale, &status);
        UResourceBundle* dspbundle=ures_getByKeyWithFallback(locbundle, _kLocaleDisplayPattern,
                                                             NULL, &status);

        separator=ures_getStringByKeyWithFallback(dspbundle, _kSeparator, &sepLen, &status);
        pattern=ures_getStringByKeyWithFallback(dspbundle, _kPattern, &patLen, &status);

        ures_close(dspbundle);
        ures_close(locbundle);
    }

    /* If we couldn't find any data, then use the defaults */
    if(sepLen == 0) {
       separator = defaultSeparator;
    }
    /* #10244: Even though separator is now a pattern, it is awkward to handle it as such
     * here since we are trying to build the display string in place in the dest buffer,
     * and to handle it as a pattern would entail having separate storage for the
     * substrings that need to be combined (the first of which may be the result of
     * previous such combinations). So for now we continue to treat the portion between
     * {0} and {1} as a string to be appended when joining substrings, ignoring anything
     * that is before {0} or after {1} (no existing separator pattern has any such thing).
     * This is similar to how pattern is handled below.
     */
    {
        UChar *p0=u_strstr(separator, sub0);
        UChar *p1=u_strstr(separator, sub1);
        if (p0==NULL || p1==NULL || p1<p0) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        separator = (const UChar *)p0 + subLen;
        sepLen = static_cast<int32_t>(p1 - separator);
    }

    if(patLen==0 || (patLen==defaultPatLen && !u_strncmp(pattern, defaultPattern, patLen))) {
        pattern=defaultPattern;
        patLen=defaultPatLen;
        sub0Pos=defaultSub0Pos;
        sub1Pos=defaultSub1Pos;
        // use default formatOpenParen etc. set above
    } else { /* non-default pattern */
        UChar *p0=u_strstr(pattern, sub0);
        UChar *p1=u_strstr(pattern, sub1);
        if (p0==NULL || p1==NULL) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        sub0Pos = static_cast<int32_t>(p0-pattern);
        sub1Pos = static_cast<int32_t>(p1-pattern);
        if (sub1Pos < sub0Pos) { /* a very odd pattern */
            int32_t t=sub0Pos; sub0Pos=sub1Pos; sub1Pos=t;
            langi=1;
        }
        if (u_strchr(pattern, 0xFF08) != NULL) {
            formatOpenParen         = 0xFF08; // fullwidth (
            formatReplaceOpenParen  = 0xFF3B; // fullwidth [
            formatCloseParen        = 0xFF09; // fullwidth )
            formatReplaceCloseParen = 0xFF3D; // fullwidth ]
        }
    }

    /* We loop here because there is one case in which after the first pass we could need to
     * reextract the data.  If there's initial padding before the first element, we put in
     * the padding and then write that element.  If it turns out there's no second element,
     * we didn't need the padding.  If we do need the data (no preflight), and the first element
     * would have fit but for the padding, we need to reextract.  In this case (only) we
     * adjust the parameters so padding is not added, and repeat.
     */
    do {
        UChar* p=dest;
        int32_t patPos=0; /* position in the pattern, used for non-substitution portions */
        int32_t langLen=0; /* length of language substitution */
        int32_t langPos=0; /* position in output of language substitution */
        int32_t restLen=0; /* length of 'everything else' substitution */
        int32_t restPos=0; /* position in output of 'everything else' substitution */
        UEnumeration* kenum = NULL; /* keyword enumeration */

        /* prefix of pattern, extremely likely to be empty */
        if(sub0Pos) {
            if(destCapacity >= sub0Pos) {
                while (patPos < sub0Pos) {
                    *p++ = pattern[patPos++];
                }
            } else {
                patPos=sub0Pos;
            }
            length=sub0Pos;
        } else {
            length=0;
        }

        for(int32_t subi=0,resti=0;subi<2;) { /* iterate through patterns 0 and 1*/
            UBool subdone = FALSE; /* set true when ready to move to next substitution */

            /* prep p and cap for calls to get display components, pin cap to 0 since
               they complain if cap is negative */
            int32_t cap=destCapacity-length;
            if (cap <= 0) {
                cap=0;
            } else {
                p=dest+length;
            }

            if (subi == langi) { /* {0}*/
                if(haveLang) {
                    langPos=length;
                    langLen=uloc_getDisplayLanguage(locale, displayLocale, p, cap, pErrorCode);
                    length+=langLen;
                    haveLang=langLen>0;
                }
                subdone=TRUE;
            } else { /* {1} */
                if(!haveRest) {
                    subdone=TRUE;
                } else {
                    int32_t len; /* length of component (plus other stuff) we just fetched */
                    switch(resti++) {
                        case 0:
                            restPos=length;
                            len=uloc_getDisplayScriptInContext(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 1:
                            len=uloc_getDisplayCountry(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 2:
                            len=uloc_getDisplayVariant(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 3:
                            kenum = uloc_openKeywords(locale, pErrorCode);
                            U_FALLTHROUGH;
                        default: {
                            const char* kw=uenum_next(kenum, &len, pErrorCode);
                            if (kw == NULL) {
                                uenum_close(kenum);
                                len=0; /* mark that we didn't add a component */
                                subdone=TRUE;
                            } else {
                                /* incorporating this behavior into the loop made it even more complex,
                                   so just special case it here */
                                len = uloc_getDisplayKeyword(kw, displayLocale, p, cap, pErrorCode);
                                if(len) {
                                    if(len < cap) {
                                        p[len]=0x3d; /* '=', assume we'll need it */
                                    }
                                    len+=1;

                                    /* adjust for call to get keyword */
                                    cap-=len;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p+=len;
                                    }
                                }
                                /* reset for call below */
                                if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                                    *pErrorCode=U_ZERO_ERROR;
                                }
                                int32_t vlen = uloc_getDisplayKeywordValue(locale, kw, displayLocale,
                                                                           p, cap, pErrorCode);
                                if(len) {
                                    if(vlen==0) {
                                        --len; /* remove unneeded '=' */
                                    }
                                    /* restore cap and p to what they were at start */
                                    cap=destCapacity-length;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p=dest+length;
                                    }
                                }
                                len+=vlen; /* total we added for key + '=' + value */
                            }
                        } break;
                    } /* end switch */

                    if (len>0) {
                        /* we addeed a component, so add separator and write it if there's room. */
                        if(len+sepLen<=cap) {
                            const UChar * plimit = p + len;
                            for (; p < plimit; p++) {
                                if (*p == formatOpenParen) {
                                    *p = formatReplaceOpenParen;
                                } else if (*p == formatCloseParen) {
                                    *p = formatReplaceCloseParen;
                                }
                            }
                            for(int32_t i=0;i<sepLen;++i) {
                                *p++=separator[i];
                            }
                        }
                        length+=len+sepLen;
                    } else if(subdone) {
                        /* remove separator if we added it */
                        if (length!=restPos) {
                            length-=sepLen;
                        }
                        restLen=length-restPos;
                        haveRest=restLen>0;
                    }
                }
            }

            if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                *pErrorCode=U_ZERO_ERROR;
            }

            if(subdone) {
                if(haveLang && haveRest) {
                    /* append internal portion of pattern, the first time,
                       or last portion of pattern the second time */
                    int32_t padLen;
                    patPos+=subLen;
                    padLen=(subi==0 ? sub1Pos : patLen)-patPos;
                    if(length+padLen < destCapacity) {
                        p=dest+length;
                        for(int32_t i=0;i<padLen;++i) {
                            *p++=pattern[patPos++];
                        }
                    } else {
                        patPos+=padLen;
                    }
                    length+=padLen;
                } else if(subi==0) {
                    /* don't have first component, reset for second component */
                    sub0Pos=0;
                    length=0;
                } else if(length>0) {
                    /* true length is the length of just the component we got. */
                    length=haveLang?langLen:restLen;
                    if(dest && sub0Pos!=0) {
                        if (sub0Pos+length<=destCapacity) {
                            /* first component not at start of result,
                               but we have full component in buffer. */
                            u_memmove(dest, dest+(haveLang?langPos:restPos), length);
                        } else {
                            /* would have fit, but didn't because of pattern prefix. */
                            sub0Pos=0; /* stops initial padding (and a second retry,
                                          so we won't end up here again) */
                            retry=TRUE;
                        }
                    }
                }

                ++subi; /* move on to next substitution */
            }
        }
    } while(retry);

    return u_terminateUChars(dest, destCapacity, length, pErrorCode);
}